

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_NormalIterators_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_NormalIterators_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  iterator it;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  AssertionResult *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  Type in_stack_fffffffffffffe5c;
  AssertHelper *in_stack_fffffffffffffe60;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char *in_stack_fffffffffffffe98;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffea0;
  AssertionResult *in_stack_fffffffffffffea8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  const_iterator local_128;
  undefined1 local_101;
  AssertionResult local_100;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_f0 [3];
  value_type local_a4;
  string local_a0 [64];
  const_iterator local_60;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_40;
  undefined1 local_19;
  AssertionResult local_18;
  
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffe70);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe70);
  local_19 = google::
             dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_40,&local_60);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe30,
             (bool *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(type *)0xa36aea)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0._M_head_impl,
               in_stack_fffffffffffffe98,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(local_a0);
    testing::Message::~Message((Message *)0xa36bab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa36c42);
  this_00 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_a4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(this_00,in_stack_fffffffffffffe2c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffe70);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe70);
  local_101 = google::
              dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(local_f0,&local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(type *)0xa36ce1)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0._M_head_impl,
               in_stack_fffffffffffffe98,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    testing::Message::~Message((Message *)0xa36db4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa36e48);
  google::
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_00);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe70);
  uVar2 = google::
          dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(local_f0,(const_iterator *)&stack0xfffffffffffffe70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(type *)0xa36e93)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0._M_head_impl,
               in_stack_fffffffffffffe98,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    testing::Message::~Message((Message *)0xa36f45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa36fc7);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, NormalIterators) {
  EXPECT_TRUE(this->ht_.begin() == this->ht_.end());
  this->ht_.insert(this->UniqueObject(1));
  {
    typename TypeParam::iterator it = this->ht_.begin();
    EXPECT_TRUE(it != this->ht_.end());
    ++it;
    EXPECT_TRUE(it == this->ht_.end());
  }
}